

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void EndMode2D(void)

{
  Matrix *pMVar1;
  float16 buffer;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  pMVar1 = RLGL.State.currentMatrix;
  (RLGL.State.currentMatrix)->m0 = 1.0;
  pMVar1->m4 = 0.0;
  pMVar1->m8 = 0.0;
  pMVar1->m12 = 0.0;
  pMVar1->m1 = 0.0;
  pMVar1->m5 = 1.0;
  pMVar1->m9 = 0.0;
  pMVar1->m13 = 0.0;
  pMVar1->m2 = 0.0;
  pMVar1->m6 = 0.0;
  pMVar1->m10 = 1.0;
  pMVar1->m14 = 0.0;
  pMVar1->m3 = 0.0;
  pMVar1->m7 = 0.0;
  pMVar1->m11 = 0.0;
  pMVar1->m15 = 1.0;
  local_40 = CORE.Window.screenScale.m0;
  local_3c = CORE.Window.screenScale.m1;
  local_38 = CORE.Window.screenScale.m2;
  local_34 = CORE.Window.screenScale.m3;
  local_30 = CORE.Window.screenScale.m4;
  local_2c = CORE.Window.screenScale.m5;
  local_28 = CORE.Window.screenScale.m6;
  local_24 = CORE.Window.screenScale.m7;
  local_20 = CORE.Window.screenScale.m8;
  local_1c = CORE.Window.screenScale.m9;
  local_18 = CORE.Window.screenScale.m10;
  local_14 = CORE.Window.screenScale.m11;
  local_10 = CORE.Window.screenScale.m12;
  local_c = CORE.Window.screenScale.m13;
  local_8 = CORE.Window.screenScale.m14;
  local_4 = CORE.Window.screenScale.m15;
  rlMultMatrixf(&local_40);
  return;
}

Assistant:

void EndMode2D(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlLoadIdentity();               // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling if required
}